

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pp.cpp
# Opt level: O3

int __thiscall glslang::TPpContext::CPPundef(TPpContext *this,TPpToken *ppToken)

{
  _Rb_tree_header *p_Var1;
  TParseContextBase *pTVar2;
  int iVar3;
  int iVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  
  iVar3 = scanToken(this,ppToken);
  pTVar2 = this->parseContext;
  if (iVar3 == 0xa2) {
    (*(pTVar2->super_TParseVersions)._vptr_TParseVersions[0x37])
              (pTVar2,ppToken,ppToken->name,"#undef");
    iVar3 = TStringAtomMap::getAtom(&this->atomStrings,ppToken->name);
    p_Var6 = (this->macroDefs).
             super_map<int,_glslang::TPpContext::MacroSymbol,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TPpContext::MacroSymbol>_>_>
             ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var6 != (_Base_ptr)0x0) {
      p_Var1 = &(this->macroDefs).
                super_map<int,_glslang::TPpContext::MacroSymbol,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TPpContext::MacroSymbol>_>_>
                ._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = &p_Var1->_M_header;
      do {
        if (iVar3 <= (int)p_Var6[1]._M_color) {
          p_Var5 = p_Var6;
        }
        p_Var6 = (&p_Var6->_M_left)[(int)p_Var6[1]._M_color < iVar3];
      } while (p_Var6 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var5 != p_Var1) && ((int)p_Var5[1]._M_color <= iVar3)) {
        *(byte *)&p_Var5[3]._M_left = *(byte *)&p_Var5[3]._M_left | 4;
      }
    }
    iVar4 = scanToken(this,ppToken);
    iVar3 = 10;
    if (iVar4 != 10) {
      (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                (this->parseContext,ppToken,"can only be followed by a single macro name","#undef",
                 "");
      iVar3 = iVar4;
    }
  }
  else {
    (*(pTVar2->super_TParseVersions)._vptr_TParseVersions[0x2f])
              (pTVar2,ppToken,"must be followed by macro name","#undef","");
  }
  return iVar3;
}

Assistant:

int TPpContext::CPPundef(TPpToken* ppToken)
{
    int token = scanToken(ppToken);
    if (token != PpAtomIdentifier) {
        parseContext.ppError(ppToken->loc, "must be followed by macro name", "#undef", "");

        return token;
    }

    parseContext.reservedPpErrorCheck(ppToken->loc, ppToken->name, "#undef");

    MacroSymbol* macro = lookupMacroDef(atomStrings.getAtom(ppToken->name));
    if (macro != nullptr)
        macro->undef = 1;
    token = scanToken(ppToken);
    if (token != '\n')
        parseContext.ppError(ppToken->loc, "can only be followed by a single macro name", "#undef", "");

    return token;
}